

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O1

Matrix3f * Matrix3f::rotation(Matrix3f *__return_storage_ptr__,Vector3f *rDirection,float radians)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  ulong uVar8;
  float *pfVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  float fVar12;
  undefined1 auVar14 [16];
  double dVar13;
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  Vector3f normalizedDirection;
  Vector3f local_1c;
  undefined1 extraout_var [56];
  
  Vector3f::normalized(&local_1c);
  auVar15._0_8_ = cos((double)radians);
  auVar15._8_56_ = extraout_var;
  auVar14._0_4_ = (float)auVar15._0_8_;
  auVar14._4_12_ = auVar15._4_12_;
  dVar13 = sin((double)radians);
  fVar12 = (float)dVar13;
  pfVar9 = Vector3f::x(&local_1c);
  fVar1 = *pfVar9;
  pfVar9 = Vector3f::y(&local_1c);
  fVar2 = *pfVar9;
  pfVar9 = Vector3f::z(&local_1c);
  fVar5 = 1.0 - auVar14._0_4_;
  auVar6 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar5),auVar14);
  fVar4 = fVar1 * fVar12;
  auVar17._0_8_ = CONCAT44(fVar4,fVar4);
  auVar17._8_4_ = fVar4;
  auVar17._12_4_ = fVar4;
  auVar17._16_4_ = fVar4;
  auVar17._20_4_ = fVar4;
  auVar17._24_4_ = fVar4;
  auVar17._28_4_ = fVar4;
  fVar3 = *pfVar9;
  auVar20._4_4_ = fVar3;
  auVar20._0_4_ = fVar3;
  auVar20._8_4_ = fVar3;
  auVar20._12_4_ = fVar3;
  auVar10 = vblendps_avx(ZEXT416((uint)fVar2),auVar20,2);
  auVar22._0_4_ = auVar10._0_4_ * fVar12;
  auVar22._4_4_ = auVar10._4_4_ * fVar12;
  auVar22._8_4_ = auVar10._8_4_ * fVar12;
  auVar22._12_4_ = auVar10._12_4_ * fVar12;
  uVar8 = CONCAT44(auVar22._4_4_,auVar22._0_4_);
  auVar18._0_8_ = uVar8 ^ 0x8000000080000000;
  auVar18._8_4_ = -auVar22._8_4_;
  auVar18._12_4_ = -auVar22._12_4_;
  __return_storage_ptr__->m_elements[0] = auVar6._0_4_;
  auVar11 = vpermps_avx2(_DAT_001d7820,ZEXT1632(auVar10));
  auVar10 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x30);
  auVar21._16_16_ = auVar20;
  auVar21._0_16_ = auVar10;
  auVar16 = vpermps_avx2(_DAT_001d7840,auVar21);
  auVar7._4_4_ = auVar11._4_4_ * auVar16._4_4_;
  auVar7._0_4_ = auVar11._0_4_ * auVar16._0_4_;
  auVar7._8_4_ = auVar11._8_4_ * auVar16._8_4_;
  auVar7._12_4_ = auVar11._12_4_ * auVar16._12_4_;
  auVar7._16_4_ = auVar11._16_4_ * auVar16._16_4_;
  auVar7._20_4_ = auVar11._20_4_ * auVar16._20_4_;
  auVar7._24_4_ = auVar11._24_4_ * auVar16._24_4_;
  auVar7._28_4_ = auVar11._28_4_;
  auVar16._4_4_ = fVar5;
  auVar16._0_4_ = fVar5;
  auVar16._8_4_ = fVar5;
  auVar16._12_4_ = fVar5;
  auVar16._16_4_ = fVar5;
  auVar16._20_4_ = fVar5;
  auVar16._24_4_ = fVar5;
  auVar16._28_4_ = fVar5;
  auVar10 = vpermi2ps_avx512vl(_DAT_001d78c0,auVar18,auVar22);
  auVar10 = vinsertps_avx(auVar10,auVar14,0x30);
  auVar11 = vblendps_avx(ZEXT1632(auVar10),auVar17,0x10);
  auVar19._4_4_ = auVar22._0_4_;
  auVar19._0_4_ = auVar22._0_4_;
  auVar19._8_4_ = auVar22._0_4_;
  auVar19._12_4_ = auVar22._0_4_;
  auVar19._16_4_ = auVar22._0_4_;
  auVar19._20_4_ = auVar22._0_4_;
  auVar19._24_4_ = auVar22._0_4_;
  auVar19._28_4_ = auVar22._0_4_;
  auVar11 = vblendps_avx(auVar11,auVar19,0x20);
  auVar11 = vpermi2ps_avx512vl(_DAT_001d7860,auVar11,
                               ZEXT1632(CONCAT412(-fVar4,CONCAT48(-fVar4,auVar17._0_8_ ^
                                                                         0x8000000080000000))));
  auVar10 = vfmadd231ps_fma(auVar11,auVar7,auVar16);
  *(undefined1 (*) [32])(__return_storage_ptr__->m_elements + 1) = ZEXT1632(auVar10);
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::rotation( const Vector3f& rDirection, float radians )
{
	Vector3f normalizedDirection = rDirection.normalized();
	
	float cosTheta = cos( radians );
	float sinTheta = sin( radians );

	float x = normalizedDirection.x();
	float y = normalizedDirection.y();
	float z = normalizedDirection.z();

	return Matrix3f
		(
			x * x * ( 1.0f - cosTheta ) + cosTheta,			y * x * ( 1.0f - cosTheta ) - z * sinTheta,		z * x * ( 1.0f - cosTheta ) + y * sinTheta,
			x * y * ( 1.0f - cosTheta ) + z * sinTheta,		y * y * ( 1.0f - cosTheta ) + cosTheta,			z * y * ( 1.0f - cosTheta ) - x * sinTheta,
			x * z * ( 1.0f - cosTheta ) - y * sinTheta,		y * z * ( 1.0f - cosTheta ) + x * sinTheta,		z * z * ( 1.0f - cosTheta ) + cosTheta
		);
}